

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsAccessMutable(void)

{
  reference piVar1;
  ostream *poVar2;
  char *pcVar3;
  initializer_list<int> __l;
  allocator_type local_39;
  Span<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> values;
  
  span.m_ptr = (pointer)0x200000001;
  span.m_size.m_size = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,&local_39);
  span.m_ptr = values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
  if ((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0) {
    span.m_ptr = (pointer)0x0;
  }
  span.m_size.m_size =
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&span,0);
  if (*piVar1 == 1) {
    piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&span,0);
    *piVar1 = 10;
    piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&span,0);
    if (*piVar1 == 10) {
      MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&span,5);
      poVar2 = std::operator<<((ostream *)&std::clog,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xe0);
      std::operator<<(poVar2,": expected exception, but none thrown.\n");
      goto LAB_00174e9b;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xdd);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar3 = "(span[0]) == (10)";
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xdb);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar3 = "(span[0]) == (1)";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar2);
LAB_00174e9b:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return 1;
}

Assistant:

int testSpanTestsAccessMutable()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    ML_ASSERT_EQ(span[0], 1);
    span[0] = 10;
    ML_ASSERT_EQ(span[0], 10);

#if !defined(NDEBUG)
    ML_ASSERT_THROWS(span[5], std::range_error);
#endif

    ML_ASSERT_EQ(span.At(1), 2);
    span.At(1) = 20;
    ML_ASSERT_EQ(span.At(1), 20);

    ML_ASSERT_THROWS(span.At(5), std::range_error);

    return 0;
}